

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctoquadIdentifier.cpp
# Opt level: O1

bool __thiscall UnifiedRegex::OctoquadIdentifier::UnionChar(OctoquadIdentifier *this,Char c)

{
  char *pcVar1;
  int iVar2;
  bool bVar3;
  
  if (7 < this->currPatternLength) {
    return false;
  }
  if ((uint)this->currPatternNum < 2) {
    iVar2 = GetOrAddCharCode(this,c);
    bVar3 = -1 < iVar2;
    if (bVar3) {
      pcVar1 = this->patternBits[this->currPatternNum] + this->currPatternLength;
      *pcVar1 = *pcVar1 | (byte)(1 << ((byte)iVar2 & 0x1f));
      bVar3 = true;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool OctoquadIdentifier::UnionChar(Char c)
    {
        if (currPatternLength >= TrigramInfo::PatternLength || currPatternNum < 0 || currPatternNum >= NumPatterns)
            return false;
        int code = GetOrAddCharCode(c);
        if (code < 0)
            return false;
        patternBits[currPatternNum][currPatternLength] |= 1 << code;
        return true;
    }